

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::handleExtremes(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *lp)

{
  uint *puVar1;
  pointer pnVar2;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Item *pIVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  Item *pIVar5;
  char cVar6;
  undefined8 *puVar7;
  undefined1 auVar8 [8];
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  _Var9;
  int iVar10;
  element_type *peVar11;
  undefined1 auVar12 [16];
  int32_t iVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  double *pdVar17;
  FreeConstraintPS *this_02;
  int *piVar18;
  fpclass_type *pfVar19;
  char *pcVar20;
  int iVar21;
  fpclass_type fVar22;
  ulong uVar23;
  SPxOut *pSVar24;
  char *__filename;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *r;
  ostream *os;
  long lVar25;
  fpclass_type fVar26;
  uint uVar27;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar28;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *pAVar29;
  Real eps;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lhs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxVal;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_11;
  undefined1 local_628 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_620;
  uint local_618 [3];
  undefined3 uStack_60b;
  uint local_608;
  undefined3 uStack_603;
  int local_600;
  bool local_5fc;
  undefined8 local_5f8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_5f0;
  ulong local_5e8;
  ulong local_5e0;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_5d8;
  int local_5cc;
  element_type *local_5c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5c0;
  uint local_5b8 [2];
  uint auStack_5b0 [2];
  uint local_5a8 [2];
  int local_5a0;
  bool local_59c;
  fpclass_type local_598;
  fpclass_type afStack_594 [3];
  element_type *local_588;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_580;
  uint local_578 [2];
  uint auStack_570 [2];
  uint local_568 [2];
  int local_560;
  bool local_55c;
  fpclass_type local_558;
  fpclass_type afStack_554 [3];
  undefined1 local_548 [16];
  uint local_538 [3];
  undefined3 uStack_52b;
  uint local_528 [3];
  bool local_51c;
  undefined8 local_518;
  undefined4 local_50c;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_508;
  ulong uStack_500;
  element_type *local_4f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4f0;
  uint local_4e8 [3];
  undefined3 uStack_4db;
  uint local_4d8;
  undefined3 uStack_4d3;
  int local_4d0;
  bool local_4cc;
  undefined8 local_4c8;
  element_type *local_4b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_4b0;
  uint local_4a8 [2];
  uint auStack_4a0 [2];
  uint local_498 [2];
  int local_490;
  bool local_48c;
  fpclass_type local_488;
  int32_t iStack_484;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_478;
  ulong uStack_470;
  ulong local_460;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_458;
  ulong uStack_450;
  undefined1 local_448 [8];
  undefined8 uStack_440;
  uint local_438 [3];
  undefined3 uStack_42b;
  uint local_428;
  undefined3 uStack_423;
  int local_420;
  bool local_41c;
  undefined8 local_418;
  shared_ptr<soplex::Tolerances> local_408;
  element_type *local_3f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3f0;
  uint local_3e8 [2];
  uint auStack_3e0 [2];
  uint local_3d8 [2];
  int local_3d0;
  bool local_3cc;
  fpclass_type local_3c8;
  int32_t iStack_3c4;
  element_type *local_3b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3b0;
  uint local_3a8 [2];
  undefined8 uStack_3a0;
  uint local_398 [4];
  element_type *local_388;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_380;
  uint local_378 [2];
  uint auStack_370 [2];
  uint local_368 [4];
  element_type *local_358;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_350;
  uint local_348 [2];
  uint auStack_340 [2];
  uint local_338 [4];
  element_type *local_328;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_320;
  uint local_318 [2];
  uint auStack_310 [2];
  uint local_308 [4];
  element_type *local_2f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2f0;
  uint local_2e8 [2];
  uint auStack_2e0 [2];
  uint local_2d8 [4];
  element_type *local_2c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_2c0;
  uint local_2b8 [2];
  uint auStack_2b0 [2];
  uint local_2a8 [2];
  int local_2a0;
  bool local_29c;
  fpclass_type local_298;
  int32_t iStack_294;
  element_type *local_288;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_280;
  uint local_278 [2];
  uint auStack_270 [2];
  uint local_268 [2];
  int local_260;
  bool local_25c;
  fpclass_type local_258;
  int32_t iStack_254;
  element_type *local_248;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_240;
  uint local_238 [2];
  uint auStack_230 [2];
  uint local_228 [2];
  int local_220;
  bool local_21c;
  fpclass_type local_218;
  int32_t iStack_214;
  element_type *local_208;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_200;
  uint local_1f8 [2];
  uint auStack_1f0 [2];
  uint local_1e8 [2];
  int local_1e0;
  bool local_1dc;
  fpclass_type local_1d8;
  int32_t iStack_1d4;
  element_type *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1c0;
  uint local_1b8 [2];
  uint auStack_1b0 [2];
  uint local_1a8 [2];
  int local_1a0;
  bool local_19c;
  fpclass_type local_198;
  int32_t iStack_194;
  element_type *local_188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_180;
  uint local_178 [2];
  uint auStack_170 [2];
  uint local_168 [2];
  int local_160;
  bool local_15c;
  undefined8 local_158;
  cpp_dec_float<50U,_int,_void> local_148;
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_5f0 = lp;
  ::soplex::infinity::__tls_init();
  pdVar17 = (double *)__tls_get_addr(&PTR_003b4b70);
  local_508 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
               *)*pdVar17;
  local_418._0_4_ = cpp_dec_float_finite;
  local_418._4_4_ = 10;
  local_448._0_4_ = 0;
  local_448._4_4_ = 0;
  uStack_440._0_4_ = 0;
  uStack_440._4_4_ = 0;
  local_438[0] = 0;
  local_438[1] = 0;
  stack0xfffffffffffffbd0 = 0;
  uStack_42b = 0;
  _local_428 = 0;
  uStack_423 = 0;
  local_420 = 0;
  local_41c = false;
  uStack_500 = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_448,(double)local_508);
  local_4c8._0_4_ = cpp_dec_float_finite;
  local_4c8._4_4_ = 10;
  local_4f8 = (element_type *)0x0;
  p_Stack_4f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4e8[0] = 0;
  local_4e8[1] = 0;
  stack0xfffffffffffffb20 = 0;
  uStack_4db = 0;
  _local_4d8 = 0;
  uStack_4d3 = 0;
  local_4d0 = 0;
  local_4cc = false;
  local_5f8._0_4_ = cpp_dec_float_finite;
  local_5f8._4_4_ = 10;
  _local_628 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                )ZEXT816(0);
  local_618[0] = 0;
  local_618[1] = 0;
  stack0xfffffffffffff9f0 = 0;
  uStack_60b = 0;
  _local_608 = 0;
  uStack_603 = 0;
  local_600 = 0;
  local_5fc = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_628,5.0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)&local_4f8,(cpp_dec_float<50U,_int,_void> *)local_448,
             (cpp_dec_float<50U,_int,_void> *)local_628);
  feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_588,this);
  local_5f8._0_4_ = cpp_dec_float_finite;
  local_5f8._4_4_ = 10;
  _local_628 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                )ZEXT816(0);
  local_618[0] = 0;
  local_618[1] = 0;
  stack0xfffffffffffff9f0 = 0;
  uStack_60b = 0;
  _local_608 = 0;
  uStack_603 = 0;
  local_600 = 0;
  local_5fc = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_628,0.01);
  local_448 = (undefined1  [8])local_588;
  uStack_440 = p_Stack_580;
  local_438[0] = local_578[0];
  local_438[1] = local_578[1];
  stack0xfffffffffffffbd0 = auStack_570._0_5_;
  uStack_42b = auStack_570[1]._1_3_;
  _local_428 = local_568._0_5_;
  uStack_423 = local_568[1]._1_3_;
  local_420 = local_560;
  local_41c = local_55c;
  local_418._0_4_ = local_558;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            ((cpp_dec_float<50U,_int,_void> *)local_448,(cpp_dec_float<50U,_int,_void> *)local_628);
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_588,this);
  pSVar28 = local_5f0;
  if ((((fpclass_type)local_418 == cpp_dec_float_NaN) || (local_558 == cpp_dec_float_NaN)) ||
     (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         ((cpp_dec_float<50U,_int,_void> *)local_448,
                          (cpp_dec_float<50U,_int,_void> *)&local_588), -1 < iVar15)) {
    puVar7 = &local_418;
    _local_608 = _local_428;
    uStack_603 = uStack_423;
    local_618[0] = local_438[0];
    local_618[1] = local_438[1];
    stack0xfffffffffffff9f0 = stack0xfffffffffffffbd0;
    uStack_60b = uStack_42b;
    _Stack_620._M_pi = uStack_440;
    local_628 = local_448;
    local_600 = local_420;
    local_5fc = local_41c;
    local_5f8._0_4_ = (fpclass_type)local_418;
  }
  else {
    epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_628,this);
    puVar7 = &local_5f8;
    pSVar28 = local_5f0;
    local_418._0_4_ = (fpclass_type)local_5f8;
  }
  _local_428 = _local_608;
  uStack_423 = uStack_603;
  local_438[0] = local_618[0];
  local_438[1] = local_618[1];
  stack0xfffffffffffffbd0 = stack0xfffffffffffff9f0;
  uStack_42b = uStack_60b;
  local_448 = local_628;
  uStack_440 = _Stack_620._M_pi;
  local_418._4_4_ = *(int32_t *)((long)puVar7 + 4);
  uVar23 = (ulong)(pSVar28->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum;
  local_5cc = 0;
  local_5e0 = 0;
  local_460 = 0;
  local_5d8 = this;
  local_420 = local_600;
  local_41c = local_5fc;
  if (0 < (long)uVar23) {
    local_478 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                 *)((ulong)local_508 ^ 0x8000000000000000);
    uStack_470 = uStack_500 ^ 0x8000000000000000;
    local_458 = &this->m_hist;
    local_460 = 0;
    local_5e0 = 0;
    lVar25 = uVar23 * 0x38;
    do {
      pnVar2 = (pSVar28->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_568 = *(uint (*) [2])((long)pnVar2[-1].m_backend.data._M_elems + lVar25 + 0x20);
      puVar7 = (undefined8 *)((long)pnVar2[-1].m_backend.data._M_elems + lVar25);
      local_588 = (element_type *)*puVar7;
      p_Stack_580 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar7[1];
      puVar1 = (uint *)((long)pnVar2[-1].m_backend.data._M_elems + lVar25 + 0x10);
      local_578 = *(uint (*) [2])puVar1;
      auStack_570 = *(uint (*) [2])(puVar1 + 2);
      local_560 = *(int *)((long)(&pnVar2[-1].m_backend.data + 1) + lVar25);
      local_55c = *(bool *)((long)(&pnVar2[-1].m_backend.data + 1) + lVar25 + 4U);
      local_558 = *(fpclass_type *)((long)(&pnVar2[-1].m_backend.data + 1) + lVar25 + 8U);
      afStack_554[0] = *(fpclass_type *)((long)(&pnVar2[-1].m_backend.data + 1) + lVar25 + 0xcU);
      fVar26 = cpp_dec_float_NaN;
      if (local_558 == cpp_dec_float_NaN) {
LAB_002f7fd4:
        fVar22 = afStack_554[0];
        bVar14 = local_55c;
        iVar15 = local_560;
        local_2d8[0] = local_568[0];
        local_2d8[1] = local_568[1];
        local_2e8[0] = local_578[0];
        local_2e8[1] = local_578[1];
        auStack_2e0[0] = auStack_570[0];
        auStack_2e0[1] = auStack_570[1];
        local_2f8 = local_588;
        _Stack_2f0._M_pi = p_Stack_580;
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_68,local_5d8);
        _local_608 = (undefined5)local_2d8._0_8_;
        uStack_603 = SUB83(local_2d8._0_8_,5);
        local_618[0] = local_2e8[0];
        local_618[1] = local_2e8[1];
        stack0xfffffffffffff9f0 = auStack_2e0._0_5_;
        uStack_60b = auStack_2e0[1]._1_3_;
        _Stack_620._M_pi = _Stack_2f0._M_pi;
        local_628 = (undefined1  [8])local_2f8;
        _Var9 = _local_628;
        local_5f8._4_4_ = fVar22;
        local_5f8._0_4_ = fVar26;
        local_5fc = bVar14;
        if (((bVar14 & 1U) != 0) &&
           (local_628._0_4_ = SUB84(local_2f8,0),
           local_628._0_4_ != 0 || fVar26 != cpp_dec_float_finite)) {
          local_5fc = (bool)(bVar14 ^ 1);
        }
        _local_628 = _Var9;
        local_600 = iVar15;
        if (((fVar26 == cpp_dec_float_NaN) || (local_68.fpclass == cpp_dec_float_NaN)) ||
           (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_628,&local_68), 0 < iVar15))
        goto LAB_002f80c5;
        pSVar28 = local_5f0;
        pAVar29 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                   *)0x0;
LAB_002f82e5:
        _Stack_620._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_628 = (undefined1  [8])0x0;
        local_5f8._0_4_ = cpp_dec_float_finite;
        local_5f8._4_4_ = 10;
        local_5fc = false;
        local_600 = 0;
        uStack_603 = 0;
        _local_608 = 0;
        uStack_60b = 0;
        stack0xfffffffffffff9f0 = 0;
        local_618[0] = 0;
        local_618[1] = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_628,(double)pAVar29);
        (*(pSVar28->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x33])(pSVar28,(ulong)((int)uVar23 - 1),local_628,0);
        local_5e0 = (ulong)((int)local_5e0 + 1);
      }
      else {
        local_5f8._0_4_ = cpp_dec_float_finite;
        local_5f8._4_4_ = 10;
        _local_628 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_618[0] = 0;
        local_618[1] = 0;
        stack0xfffffffffffff9f0 = 0;
        uStack_60b = 0;
        _local_608 = 0;
        uStack_603 = 0;
        local_600 = 0;
        local_5fc = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_628,0.0);
        iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)&local_588,
                            (cpp_dec_float<50U,_int,_void> *)local_628);
        fVar26 = local_558;
        if (iVar15 != 0) goto LAB_002f7fd4;
LAB_002f80c5:
        pSVar28 = local_5f0;
        ::soplex::infinity::__tls_init();
        local_5f8._0_4_ = cpp_dec_float_finite;
        local_5f8._4_4_ = 10;
        _local_628 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_618[0] = 0;
        local_618[1] = 0;
        stack0xfffffffffffff9f0 = 0;
        uStack_60b = 0;
        _local_608 = 0;
        uStack_603 = 0;
        local_600 = 0;
        local_5fc = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_628,(double)local_478);
        if (((local_558 != cpp_dec_float_NaN) && ((fpclass_type)local_5f8 != cpp_dec_float_NaN)) &&
           (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)&local_588,
                                (cpp_dec_float<50U,_int,_void> *)local_628), 0 < iVar15)) {
          auStack_5b0[1]._1_3_ = uStack_4db;
          auStack_5b0._0_5_ = stack0xfffffffffffffb20;
          local_5c8 = local_4f8;
          peVar11 = local_5c8;
          p_Stack_5c0 = p_Stack_4f0;
          local_5a8[1]._1_3_ = uStack_4d3;
          local_5a8._0_5_ = _local_4d8;
          local_5b8[0] = local_4e8[0];
          local_5b8[1] = local_4e8[1];
          local_5a0 = local_4d0;
          local_59c = local_4cc;
          local_598 = (fpclass_type)local_4c8;
          afStack_594[0] = local_4c8._4_4_;
          local_5c8._0_4_ = (uint)local_4f8;
          if ((uint)local_5c8 != 0 || (fpclass_type)local_4c8 != cpp_dec_float_finite) {
            local_59c = (bool)(local_4cc ^ 1);
          }
          local_5c8 = peVar11;
          if ((((fpclass_type)local_4c8 != cpp_dec_float_NaN) && (local_558 != cpp_dec_float_NaN))
             && (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    ((cpp_dec_float<50U,_int,_void> *)&local_588,
                                     (cpp_dec_float<50U,_int,_void> *)&local_5c8), iVar15 < 0)) {
            ::soplex::infinity::__tls_init();
            pAVar29 = local_478;
            goto LAB_002f82e5;
          }
        }
        ::soplex::infinity::__tls_init();
        local_5f8._0_4_ = cpp_dec_float_finite;
        local_5f8._4_4_ = 10;
        local_628 = (undefined1  [8])0x0;
        _Stack_620._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_618[0] = 0;
        local_618[1] = 0;
        stack0xfffffffffffff9f0 = 0;
        uStack_60b = 0;
        _local_608 = 0;
        uStack_603 = 0;
        local_600 = 0;
        local_5fc = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_628,(double)local_508);
        if (((local_558 != cpp_dec_float_NaN) && ((fpclass_type)local_5f8 != cpp_dec_float_NaN)) &&
           ((iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)&local_588,
                                 (cpp_dec_float<50U,_int,_void> *)local_628), iVar15 < 0 &&
            (((local_558 != cpp_dec_float_NaN && ((fpclass_type)local_4c8 != cpp_dec_float_NaN)) &&
             (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)&local_588,
                                  (cpp_dec_float<50U,_int,_void> *)&local_4f8), 0 < iVar15)))))) {
          ::soplex::infinity::__tls_init();
          pAVar29 = local_508;
          goto LAB_002f82e5;
        }
      }
      pnVar2 = (pSVar28->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_5a8 = *(uint (*) [2])((long)pnVar2[-1].m_backend.data._M_elems + lVar25 + 0x20);
      puVar1 = (uint *)((long)pnVar2[-1].m_backend.data._M_elems + lVar25);
      local_5c8 = *(element_type **)puVar1;
      p_Stack_5c0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar1 + 2);
      puVar1 = (uint *)((long)pnVar2[-1].m_backend.data._M_elems + lVar25 + 0x10);
      local_5b8 = *(uint (*) [2])puVar1;
      auStack_5b0 = *(uint (*) [2])(puVar1 + 2);
      local_5a0 = *(int *)((long)(&pnVar2[-1].m_backend.data + 1) + lVar25);
      local_59c = *(bool *)((long)(&pnVar2[-1].m_backend.data + 1) + lVar25 + 4U);
      local_598 = *(fpclass_type *)((long)(&pnVar2[-1].m_backend.data + 1) + lVar25 + 8U);
      afStack_594[0] = *(fpclass_type *)((long)(&pnVar2[-1].m_backend.data + 1) + lVar25 + 0xcU);
      fVar26 = cpp_dec_float_NaN;
      fVar22 = afStack_594[0];
      if (local_598 == cpp_dec_float_NaN) {
LAB_002f83dc:
        bVar14 = local_59c;
        iVar15 = local_5a0;
        local_308[0] = local_5a8[0];
        local_308[1] = local_5a8[1];
        local_318[0] = local_5b8[0];
        local_318[1] = local_5b8[1];
        auStack_310[0] = auStack_5b0[0];
        auStack_310[1] = auStack_5b0[1];
        local_328 = local_5c8;
        p_Stack_320 = p_Stack_5c0;
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_a0,local_5d8);
        _local_608 = (undefined5)local_308._0_8_;
        uStack_603 = SUB83(local_308._0_8_,5);
        local_618[0] = local_318[0];
        local_618[1] = local_318[1];
        stack0xfffffffffffff9f0 = auStack_310._0_5_;
        uStack_60b = auStack_310[1]._1_3_;
        local_628 = (undefined1  [8])local_328;
        auVar8 = local_628;
        _Stack_620._M_pi = p_Stack_320;
        local_5f8._4_4_ = fVar22;
        local_5f8._0_4_ = fVar26;
        local_5fc = bVar14;
        if (((bVar14 & 1U) != 0) &&
           (local_628._0_4_ = SUB84(local_328,0),
           local_628._0_4_ != 0 || fVar26 != cpp_dec_float_finite)) {
          local_5fc = (bool)(bVar14 ^ 1);
        }
        local_600 = iVar15;
        local_628 = auVar8;
        if (((fVar26 == cpp_dec_float_NaN) || (local_a0.fpclass == cpp_dec_float_NaN)) ||
           (local_628 = auVar8,
           iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              ((cpp_dec_float<50U,_int,_void> *)local_628,&local_a0), 0 < iVar15))
        goto LAB_002f84d1;
        this = local_5d8;
        pSVar28 = local_5f0;
        pAVar29 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                   *)0x0;
LAB_002f86f1:
        _local_628 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_5f8._0_4_ = cpp_dec_float_finite;
        local_5f8._4_4_ = 10;
        local_5fc = false;
        local_600 = 0;
        uStack_603 = 0;
        _local_608 = 0;
        uStack_60b = 0;
        stack0xfffffffffffff9f0 = 0;
        local_618[0] = 0;
        local_618[1] = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_628,(double)pAVar29);
        (*(pSVar28->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x36])(pSVar28,(ulong)((int)uVar23 - 1),local_628,0);
        local_5e0 = (ulong)((int)local_5e0 + 1);
      }
      else {
        local_5f8._0_4_ = cpp_dec_float_finite;
        local_5f8._4_4_ = 10;
        local_628 = (undefined1  [8])0x0;
        _Stack_620._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_618[0] = 0;
        local_618[1] = 0;
        stack0xfffffffffffff9f0 = 0;
        uStack_60b = 0;
        _local_608 = 0;
        uStack_603 = 0;
        local_600 = 0;
        local_5fc = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_628,0.0);
        iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)&local_5c8,
                            (cpp_dec_float<50U,_int,_void> *)local_628);
        if (iVar15 != 0) {
          fVar26 = local_598;
          fVar22 = afStack_594[0];
          goto LAB_002f83dc;
        }
LAB_002f84d1:
        this = local_5d8;
        pSVar28 = local_5f0;
        ::soplex::infinity::__tls_init();
        local_5f8._0_4_ = cpp_dec_float_finite;
        local_5f8._4_4_ = 10;
        _local_628 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_618[0] = 0;
        local_618[1] = 0;
        stack0xfffffffffffff9f0 = 0;
        uStack_60b = 0;
        _local_608 = 0;
        uStack_603 = 0;
        local_600 = 0;
        local_5fc = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_628,(double)local_478);
        if (((local_598 != cpp_dec_float_NaN) && ((fpclass_type)local_5f8 != cpp_dec_float_NaN)) &&
           (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)&local_5c8,
                                (cpp_dec_float<50U,_int,_void> *)local_628), 0 < iVar15)) {
          local_548._8_8_ = p_Stack_4f0;
          local_548._0_8_ = local_4f8;
          auVar12 = local_548;
          local_528[1]._1_3_ = uStack_4d3;
          local_528._0_5_ = _local_4d8;
          local_538[0] = local_4e8[0];
          local_538[1] = local_4e8[1];
          stack0xfffffffffffffad0 = stack0xfffffffffffffb20;
          uStack_52b = uStack_4db;
          local_528[2] = local_4d0;
          local_51c = local_4cc;
          local_518._0_4_ = (fpclass_type)local_4c8;
          local_518._4_4_ = local_4c8._4_4_;
          local_548._0_4_ = SUB84(local_4f8,0);
          if (local_548._0_4_ != 0 || (fpclass_type)local_4c8 != cpp_dec_float_finite) {
            local_51c = (bool)(local_4cc ^ 1);
          }
          local_548 = auVar12;
          if ((((fpclass_type)local_4c8 != cpp_dec_float_NaN) && (local_598 != cpp_dec_float_NaN))
             && (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    ((cpp_dec_float<50U,_int,_void> *)&local_5c8,
                                     (cpp_dec_float<50U,_int,_void> *)local_548), iVar15 < 0)) {
            ::soplex::infinity::__tls_init();
            pAVar29 = local_478;
            goto LAB_002f86f1;
          }
        }
        ::soplex::infinity::__tls_init();
        local_5f8._0_4_ = cpp_dec_float_finite;
        local_5f8._4_4_ = 10;
        _local_628 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_618[0] = 0;
        local_618[1] = 0;
        stack0xfffffffffffff9f0 = 0;
        uStack_60b = 0;
        _local_608 = 0;
        uStack_603 = 0;
        local_600 = 0;
        local_5fc = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_628,(double)local_508);
        if (((local_598 != cpp_dec_float_NaN) && ((fpclass_type)local_5f8 != cpp_dec_float_NaN)) &&
           ((iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)&local_5c8,
                                 (cpp_dec_float<50U,_int,_void> *)local_628), iVar15 < 0 &&
            (((local_598 != cpp_dec_float_NaN && ((fpclass_type)local_4c8 != cpp_dec_float_NaN)) &&
             (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)&local_5c8,
                                  (cpp_dec_float<50U,_int,_void> *)&local_4f8), 0 < iVar15)))))) {
          ::soplex::infinity::__tls_init();
          pAVar29 = local_508;
          goto LAB_002f86f1;
        }
      }
      pnVar2 = (pSVar28->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_5f8._0_4_ = cpp_dec_float_finite;
      local_5f8._4_4_ = 10;
      _local_628 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    )ZEXT816(0);
      local_618[0] = 0;
      local_618[1] = 0;
      stack0xfffffffffffff9f0 = 0;
      uStack_60b = 0;
      _local_608 = 0;
      uStack_603 = 0;
      local_600 = 0;
      local_5fc = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)local_628,(double)local_478);
      if (((*(int *)((long)(&pnVar2[-1].m_backend.data + 1) + lVar25 + 8U) != 2) &&
          ((fpclass_type)local_5f8 != cpp_dec_float_NaN)) &&
         (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)
                              ((long)pnVar2[-1].m_backend.data._M_elems + lVar25),
                              (cpp_dec_float<50U,_int,_void> *)local_628), iVar15 < 1)) {
        pnVar2 = (local_5f0->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_518._0_4_ = cpp_dec_float_finite;
        local_518._4_4_ = 10;
        local_548 = (undefined1  [16])0x0;
        local_538[0] = 0;
        local_538[1] = 0;
        stack0xfffffffffffffad0 = 0;
        uStack_52b = 0;
        local_528[0] = 0;
        local_528[1] = 0;
        local_528[2] = 0;
        local_51c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_548,(double)local_508);
        if (((*(int *)((long)(&pnVar2[-1].m_backend.data + 1) + lVar25 + 8U) != 2) &&
            ((fpclass_type)local_518 != cpp_dec_float_NaN)) &&
           (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)pnVar2[-1].m_backend.data._M_elems + lVar25),
                                (cpp_dec_float<50U,_int,_void> *)local_548), -1 < iVar15)) {
          this_02 = (FreeConstraintPS *)operator_new(0x88);
          local_408.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          local_408.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
          if (local_408.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_408.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_408.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_408.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_408.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          FreeConstraintPS::FreeConstraintPS(this_02,local_5f0,(int)(uVar23 - 1),&local_408);
          local_628 = (undefined1  [8])this_02;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FreeConstraintPS*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_628 + 8),this_02);
          if (local_408.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_408.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          std::
          vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
          ::push_back(&local_458->data,(value_type *)local_628);
          piVar18 = (this->m_rIdx).data;
          piVar18[uVar23 - 1] =
               piVar18[(long)(local_5f0->
                             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .set.thenum + -1];
          (*(local_5f0->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0xf])(local_5f0,uVar23 - 1 & 0xffffffff);
          piVar18 = (this->m_stat).data + 1;
          *piVar18 = *piVar18 + 1;
          if (_Stack_620._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_620._M_pi);
          }
          local_460 = (ulong)((int)local_460 + 1);
        }
      }
      bVar14 = 1 < uVar23;
      uVar23 = uVar23 - 1;
      pSVar28 = local_5f0;
      lVar25 = lVar25 + -0x38;
    } while (bVar14);
  }
  local_5e8 = 0;
  local_478 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
               *)0x0;
  if (0 < (pSVar28->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_458 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                 *)((ulong)local_508 ^ 0x8000000000000000);
    uStack_450 = uStack_500 ^ 0x8000000000000000;
    uVar23 = 0;
    local_478 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                 *)0x0;
    local_5e8 = 0;
    local_5cc = 0;
    do {
      pnVar2 = (pSVar28->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_568 = *(uint (*) [2])(pnVar2[uVar23].m_backend.data._M_elems + 8);
      local_588 = *(element_type **)&pnVar2[uVar23].m_backend.data;
      p_Stack_580 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     (pnVar2[uVar23].m_backend.data._M_elems + 2);
      puVar1 = pnVar2[uVar23].m_backend.data._M_elems + 4;
      local_578 = *(uint (*) [2])puVar1;
      auStack_570 = *(uint (*) [2])(puVar1 + 2);
      local_560 = pnVar2[uVar23].m_backend.exp;
      local_55c = pnVar2[uVar23].m_backend.neg;
      local_558 = pnVar2[uVar23].m_backend.fpclass;
      afStack_554[0] = pnVar2[uVar23].m_backend.prec_elem;
      fVar26 = cpp_dec_float_NaN;
      if (local_558 == cpp_dec_float_NaN) {
LAB_002f8a57:
        fVar22 = afStack_554[0];
        bVar14 = local_55c;
        iVar16 = local_560;
        local_338[0] = local_568[0];
        local_338[1] = local_568[1];
        local_348[0] = local_578[0];
        local_348[1] = local_578[1];
        auStack_340[0] = auStack_570[0];
        auStack_340[1] = auStack_570[1];
        local_358 = local_588;
        _Stack_350._M_pi = p_Stack_580;
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_d8,local_5d8);
        pSVar28 = local_5f0;
        _local_608 = (undefined5)local_338._0_8_;
        uStack_603 = SUB83(local_338._0_8_,5);
        local_618[0] = local_348[0];
        local_618[1] = local_348[1];
        stack0xfffffffffffff9f0 = auStack_340._0_5_;
        uStack_60b = auStack_340[1]._1_3_;
        _Stack_620._M_pi = _Stack_350._M_pi;
        local_628 = (undefined1  [8])local_358;
        _Var9 = _local_628;
        local_5f8._4_4_ = fVar22;
        local_5f8._0_4_ = fVar26;
        local_5fc = bVar14;
        if (((bVar14 & 1U) != 0) &&
           (local_628._0_4_ = SUB84(local_358,0),
           local_628._0_4_ != 0 || fVar26 != cpp_dec_float_finite)) {
          local_5fc = (bool)(bVar14 ^ 1);
        }
        iVar15 = (int)local_5e8;
        _local_628 = _Var9;
        local_600 = iVar16;
        if (((fVar26 == cpp_dec_float_NaN) || (local_d8.fpclass == cpp_dec_float_NaN)) ||
           (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_628,&local_d8), 0 < iVar16))
        goto LAB_002f8b1c;
        pAVar29 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                   *)0x0;
LAB_002f8d6d:
        _Stack_620._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_628 = (undefined1  [8])0x0;
        local_5f8._0_4_ = cpp_dec_float_finite;
        local_5f8._4_4_ = 10;
        local_5fc = false;
        local_600 = 0;
        uStack_603 = 0;
        _local_608 = 0;
        uStack_60b = 0;
        stack0xfffffffffffff9f0 = 0;
        local_618[0] = 0;
        local_618[1] = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_628,(double)pAVar29);
        (*(pSVar28->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x2a])(pSVar28,uVar23 & 0xffffffff,local_628,0);
        local_5e8 = (ulong)(iVar15 + 1);
      }
      else {
        local_5f8._0_4_ = cpp_dec_float_finite;
        local_5f8._4_4_ = 10;
        _local_628 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_618[0] = 0;
        local_618[1] = 0;
        stack0xfffffffffffff9f0 = 0;
        uStack_60b = 0;
        _local_608 = 0;
        uStack_603 = 0;
        local_600 = 0;
        local_5fc = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_628,0.0);
        iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)&local_588,
                            (cpp_dec_float<50U,_int,_void> *)local_628);
        iVar15 = (int)local_5e8;
        pSVar28 = local_5f0;
        fVar26 = local_558;
        if (iVar16 != 0) goto LAB_002f8a57;
LAB_002f8b1c:
        ::soplex::infinity::__tls_init();
        local_5f8._0_4_ = cpp_dec_float_finite;
        local_5f8._4_4_ = 10;
        _local_628 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_618[0] = 0;
        local_618[1] = 0;
        stack0xfffffffffffff9f0 = 0;
        uStack_60b = 0;
        _local_608 = 0;
        uStack_603 = 0;
        local_600 = 0;
        local_5fc = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_628,(double)local_458);
        if (((local_558 != cpp_dec_float_NaN) && ((fpclass_type)local_5f8 != cpp_dec_float_NaN)) &&
           (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)&local_588,
                                (cpp_dec_float<50U,_int,_void> *)local_628), 0 < iVar16)) {
          auStack_5b0[1]._1_3_ = uStack_4db;
          auStack_5b0._0_5_ = stack0xfffffffffffffb20;
          local_5c8 = local_4f8;
          peVar11 = local_5c8;
          p_Stack_5c0 = p_Stack_4f0;
          local_5a8[1]._1_3_ = uStack_4d3;
          local_5a8._0_5_ = _local_4d8;
          local_5b8[0] = local_4e8[0];
          local_5b8[1] = local_4e8[1];
          local_5a0 = local_4d0;
          local_59c = local_4cc;
          local_598 = (fpclass_type)local_4c8;
          afStack_594[0] = local_4c8._4_4_;
          local_5c8._0_4_ = (uint)local_4f8;
          if ((uint)local_5c8 != 0 || (fpclass_type)local_4c8 != cpp_dec_float_finite) {
            local_59c = (bool)(local_4cc ^ 1);
          }
          local_5c8 = peVar11;
          if ((((fpclass_type)local_4c8 != cpp_dec_float_NaN) && (local_558 != cpp_dec_float_NaN))
             && (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    ((cpp_dec_float<50U,_int,_void> *)&local_588,
                                     (cpp_dec_float<50U,_int,_void> *)&local_5c8), iVar16 < 0)) {
            ::soplex::infinity::__tls_init();
            pAVar29 = local_458;
            goto LAB_002f8d6d;
          }
        }
        ::soplex::infinity::__tls_init();
        local_5f8._0_4_ = cpp_dec_float_finite;
        local_5f8._4_4_ = 10;
        local_628 = (undefined1  [8])0x0;
        _Stack_620._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_618[0] = 0;
        local_618[1] = 0;
        stack0xfffffffffffff9f0 = 0;
        uStack_60b = 0;
        _local_608 = 0;
        uStack_603 = 0;
        local_600 = 0;
        local_5fc = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_628,(double)local_508);
        if (((((local_558 != cpp_dec_float_NaN) && ((fpclass_type)local_5f8 != cpp_dec_float_NaN))
             && (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    ((cpp_dec_float<50U,_int,_void> *)&local_588,
                                     (cpp_dec_float<50U,_int,_void> *)local_628), iVar16 < 0)) &&
            ((local_558 != cpp_dec_float_NaN && ((fpclass_type)local_4c8 != cpp_dec_float_NaN)))) &&
           (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)&local_588,
                                (cpp_dec_float<50U,_int,_void> *)&local_4f8), 0 < iVar16)) {
          ::soplex::infinity::__tls_init();
          pAVar29 = local_508;
          goto LAB_002f8d6d;
        }
      }
      pnVar2 = (pSVar28->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_5a8 = *(uint (*) [2])(pnVar2[uVar23].m_backend.data._M_elems + 8);
      local_5c8 = *(element_type **)&pnVar2[uVar23].m_backend.data;
      p_Stack_5c0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     (pnVar2[uVar23].m_backend.data._M_elems + 2);
      puVar1 = pnVar2[uVar23].m_backend.data._M_elems + 4;
      local_5b8 = *(uint (*) [2])puVar1;
      auStack_5b0 = *(uint (*) [2])(puVar1 + 2);
      local_5a0 = pnVar2[uVar23].m_backend.exp;
      local_59c = pnVar2[uVar23].m_backend.neg;
      local_598 = pnVar2[uVar23].m_backend.fpclass;
      afStack_594[0] = pnVar2[uVar23].m_backend.prec_elem;
      fVar26 = afStack_594[0];
      fVar22 = cpp_dec_float_NaN;
      if (local_598 == cpp_dec_float_NaN) {
LAB_002f8e5c:
        bVar14 = local_59c;
        iVar15 = local_5a0;
        local_368[0] = local_5a8[0];
        local_368[1] = local_5a8[1];
        local_378[0] = local_5b8[0];
        local_378[1] = local_5b8[1];
        auStack_370[0] = auStack_5b0[0];
        auStack_370[1] = auStack_5b0[1];
        local_388 = local_5c8;
        p_Stack_380 = p_Stack_5c0;
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_110,local_5d8);
        pSVar28 = local_5f0;
        _local_608 = (undefined5)local_368._0_8_;
        uStack_603 = SUB83(local_368._0_8_,5);
        local_618[0] = local_378[0];
        local_618[1] = local_378[1];
        stack0xfffffffffffff9f0 = auStack_370._0_5_;
        uStack_60b = auStack_370[1]._1_3_;
        local_628 = (undefined1  [8])local_388;
        auVar8 = local_628;
        _Stack_620._M_pi = p_Stack_380;
        local_5f8._4_4_ = fVar26;
        local_5f8._0_4_ = fVar22;
        local_5fc = bVar14;
        if (((bVar14 & 1U) != 0) &&
           (local_628._0_4_ = SUB84(local_388,0),
           local_628._0_4_ != 0 || fVar22 != cpp_dec_float_finite)) {
          local_5fc = (bool)(bVar14 ^ 1);
        }
        local_600 = iVar15;
        local_628 = auVar8;
        if (((fVar22 == cpp_dec_float_NaN) || (local_110.fpclass == cpp_dec_float_NaN)) ||
           (local_628 = auVar8,
           iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              ((cpp_dec_float<50U,_int,_void> *)local_628,&local_110), 0 < iVar15))
        goto LAB_002f8f47;
        this = local_5d8;
        pAVar29 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                   *)0x0;
LAB_002f916d:
        _local_628 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_5f8._0_4_ = cpp_dec_float_finite;
        local_5f8._4_4_ = 10;
        local_5fc = false;
        local_600 = 0;
        uStack_603 = 0;
        _local_608 = 0;
        uStack_60b = 0;
        stack0xfffffffffffff9f0 = 0;
        local_618[0] = 0;
        local_618[1] = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_628,(double)pAVar29);
        (*(pSVar28->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x2d])(pSVar28,uVar23 & 0xffffffff,local_628,0);
        local_5e8 = (ulong)((int)local_5e8 + 1);
      }
      else {
        local_5f8._0_4_ = cpp_dec_float_finite;
        local_5f8._4_4_ = 10;
        local_628 = (undefined1  [8])0x0;
        _Stack_620._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_618[0] = 0;
        local_618[1] = 0;
        stack0xfffffffffffff9f0 = 0;
        uStack_60b = 0;
        _local_608 = 0;
        uStack_603 = 0;
        local_600 = 0;
        local_5fc = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_628,0.0);
        iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)&local_5c8,
                            (cpp_dec_float<50U,_int,_void> *)local_628);
        pSVar28 = local_5f0;
        if (iVar15 != 0) {
          fVar26 = afStack_594[0];
          fVar22 = local_598;
          goto LAB_002f8e5c;
        }
LAB_002f8f47:
        this = local_5d8;
        ::soplex::infinity::__tls_init();
        local_5f8._0_4_ = cpp_dec_float_finite;
        local_5f8._4_4_ = 10;
        _local_628 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_618[0] = 0;
        local_618[1] = 0;
        stack0xfffffffffffff9f0 = 0;
        uStack_60b = 0;
        _local_608 = 0;
        uStack_603 = 0;
        local_600 = 0;
        local_5fc = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_628,(double)local_458);
        if (((local_598 != cpp_dec_float_NaN) && ((fpclass_type)local_5f8 != cpp_dec_float_NaN)) &&
           (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)&local_5c8,
                                (cpp_dec_float<50U,_int,_void> *)local_628), 0 < iVar15)) {
          local_548._8_8_ = p_Stack_4f0;
          local_548._0_8_ = local_4f8;
          auVar12 = local_548;
          local_528[1]._1_3_ = uStack_4d3;
          local_528._0_5_ = _local_4d8;
          local_538[0] = local_4e8[0];
          local_538[1] = local_4e8[1];
          stack0xfffffffffffffad0 = stack0xfffffffffffffb20;
          uStack_52b = uStack_4db;
          local_528[2] = local_4d0;
          local_51c = local_4cc;
          local_518._0_4_ = (fpclass_type)local_4c8;
          local_518._4_4_ = local_4c8._4_4_;
          local_548._0_4_ = SUB84(local_4f8,0);
          if (local_548._0_4_ != 0 || (fpclass_type)local_4c8 != cpp_dec_float_finite) {
            local_51c = (bool)(local_4cc ^ 1);
          }
          local_548 = auVar12;
          if ((((fpclass_type)local_4c8 != cpp_dec_float_NaN) && (local_598 != cpp_dec_float_NaN))
             && (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    ((cpp_dec_float<50U,_int,_void> *)&local_5c8,
                                     (cpp_dec_float<50U,_int,_void> *)local_548), iVar15 < 0)) {
            ::soplex::infinity::__tls_init();
            pAVar29 = local_458;
            goto LAB_002f916d;
          }
        }
        ::soplex::infinity::__tls_init();
        local_5f8._0_4_ = cpp_dec_float_finite;
        local_5f8._4_4_ = 10;
        _local_628 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_618[0] = 0;
        local_618[1] = 0;
        stack0xfffffffffffff9f0 = 0;
        uStack_60b = 0;
        _local_608 = 0;
        uStack_603 = 0;
        local_600 = 0;
        local_5fc = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_628,(double)local_508);
        if (((((local_598 != cpp_dec_float_NaN) && ((fpclass_type)local_5f8 != cpp_dec_float_NaN))
             && (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    ((cpp_dec_float<50U,_int,_void> *)&local_5c8,
                                     (cpp_dec_float<50U,_int,_void> *)local_628), iVar15 < 0)) &&
            ((local_598 != cpp_dec_float_NaN && ((fpclass_type)local_4c8 != cpp_dec_float_NaN)))) &&
           (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)&local_5c8,
                                (cpp_dec_float<50U,_int,_void> *)&local_4f8), 0 < iVar15)) {
          ::soplex::infinity::__tls_init();
          pAVar29 = local_508;
          goto LAB_002f916d;
        }
      }
      local_168[0] = local_568[0];
      local_168[1] = local_568[1];
      local_178[0] = local_578[0];
      local_178[1] = local_578[1];
      auStack_170[0] = auStack_570[0];
      auStack_170[1] = auStack_570[1];
      local_188 = local_588;
      p_Stack_180 = p_Stack_580;
      local_160 = local_560;
      local_15c = local_55c;
      local_158._4_4_ = afStack_554[0];
      local_158._0_4_ = local_558;
      local_1c8 = local_5c8;
      p_Stack_1c0 = p_Stack_5c0;
      local_1b8[0] = local_5b8[0];
      local_1b8[1] = local_5b8[1];
      auStack_1b0[0] = auStack_5b0[0];
      auStack_1b0[1] = auStack_5b0[1];
      local_1a8[0] = local_5a8[0];
      local_1a8[1] = local_5a8[1];
      local_1a0 = local_5a0;
      local_19c = local_59c;
      local_198 = local_598;
      iStack_194 = afStack_594[0];
      this_00 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      this_01 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      eps = Tolerances::epsilon(this_00);
      bVar14 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_188,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_1c8,eps);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      if (bVar14) {
        if (local_55c == true) {
          local_55c = (uint)local_588 == 0 && local_558 == cpp_dec_float_finite;
        }
        if (local_59c == true) {
          local_59c = (uint)local_5c8 == 0 && local_598 == cpp_dec_float_finite;
        }
        if (local_598 == cpp_dec_float_NaN || local_558 == cpp_dec_float_NaN) {
LAB_002f938b:
          local_528[0] = local_5a8[0];
          local_528[1] = local_5a8[1];
          local_538[0] = local_5b8[0];
          local_538[1] = local_5b8[1];
          stack0xfffffffffffffad0 = auStack_5b0._0_5_;
          uStack_52b = auStack_5b0[1]._1_3_;
          local_548._8_8_ = p_Stack_5c0;
          local_548._0_8_ = local_5c8;
          local_528[2] = local_5a0;
          local_51c = local_59c;
          pfVar19 = afStack_594;
          fVar26 = local_598;
        }
        else {
          iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)&local_588,
                              (cpp_dec_float<50U,_int,_void> *)&local_5c8);
          if (iVar15 < 1) {
            goto LAB_002f938b;
          }
          local_528[0] = local_568[0];
          local_528[1] = local_568[1];
          local_538[0] = local_578[0];
          local_538[1] = local_578[1];
          stack0xfffffffffffffad0 = auStack_570._0_5_;
          uStack_52b = auStack_570[1]._1_3_;
          local_548._8_8_ = p_Stack_580;
          local_548._0_8_ = local_588;
          local_528[2] = local_560;
          local_51c = local_55c;
          pfVar19 = afStack_554;
          fVar26 = local_558;
        }
        local_518._0_4_ = fVar26;
        local_518._4_4_ = *pfVar19;
        if (fVar26 != cpp_dec_float_NaN) {
          local_5f8._0_4_ = cpp_dec_float_finite;
          local_5f8._4_4_ = 10;
          local_628 = (undefined1  [8])0x0;
          _Stack_620._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_618[0] = 0;
          local_618[1] = 0;
          stack0xfffffffffffff9f0 = 0;
          uStack_60b = 0;
          _local_608 = 0;
          uStack_603 = 0;
          local_600 = 0;
          local_5fc = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_628,1.0);
          iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)local_548,
                              (cpp_dec_float<50U,_int,_void> *)local_628);
          if (iVar15 < 0) {
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_548,1.0);
          }
        }
        pIVar3 = (pSVar28->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem;
        iVar15 = (pSVar28->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey[uVar23].idx;
        if (0 < pIVar3[iVar15].data.
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused) {
          pIVar3 = pIVar3 + iVar15;
          uVar27 = 0;
          do {
            pNVar4 = (pIVar3->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            local_490 = pNVar4[(int)uVar27].val.m_backend.exp;
            local_48c = pNVar4[(int)uVar27].val.m_backend.neg;
            local_3c8 = pNVar4[(int)uVar27].val.m_backend.fpclass;
            iStack_3c4 = pNVar4[(int)uVar27].val.m_backend.prec_elem;
            local_4b8 = *(element_type **)pNVar4[(int)uVar27].val.m_backend.data._M_elems;
            _Stack_4b0._M_pi =
                 *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  (pNVar4[(int)uVar27].val.m_backend.data._M_elems + 2);
            puVar1 = pNVar4[(int)uVar27].val.m_backend.data._M_elems + 4;
            local_4a8 = *(uint (*) [2])puVar1;
            auStack_4a0 = *(uint (*) [2])(puVar1 + 2);
            local_498 = *(uint (*) [2])(pNVar4[(int)uVar27].val.m_backend.data._M_elems + 8);
            iStack_484 = iStack_3c4;
            local_488 = local_3c8;
            if ((local_48c == true) && ((uint)local_4b8 != 0 || local_3c8 != cpp_dec_float_finite))
            {
              local_48c = false;
            }
            local_3f8 = local_4b8;
            _Stack_3f0._M_pi = _Stack_4b0._M_pi;
            local_3e8 = local_4a8;
            auStack_3e0 = auStack_4a0;
            local_3d8 = local_498;
            local_3d0 = local_490;
            local_3cc = local_48c;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      ((cpp_dec_float<50U,_int,_void> *)&local_3f8,
                       (cpp_dec_float<50U,_int,_void> *)local_548);
            auStack_1f0[1]._1_3_ = uStack_42b;
            auStack_1f0._0_5_ = stack0xfffffffffffffbd0;
            local_208 = (element_type *)local_448;
            p_Stack_200 = uStack_440;
            local_1f8[0] = local_438[0];
            local_1f8[1] = local_438[1];
            local_1e8[1]._1_3_ = uStack_423;
            local_1e8._0_5_ = _local_428;
            local_1e0 = local_420;
            local_1dc = local_41c;
            local_1d8 = (fpclass_type)local_418;
            iStack_1d4 = local_418._4_4_;
            _local_608 = local_3d8._0_5_;
            uStack_603 = local_3d8[1]._1_3_;
            local_618[0] = local_3e8[0];
            local_618[1] = local_3e8[1];
            stack0xfffffffffffff9f0 = auStack_3e0._0_5_;
            uStack_60b = auStack_3e0[1]._1_3_;
            _Stack_620._M_pi = _Stack_3f0._M_pi;
            local_628 = (undefined1  [8])local_3f8;
            _Var9 = _local_628;
            local_600 = local_3d0;
            local_5fc = local_3cc;
            local_5f8._4_4_ = iStack_3c4;
            local_5f8._0_4_ = local_3c8;
            if ((local_3cc == true) &&
               (local_628._0_4_ = SUB84(local_3f8,0),
               local_628._0_4_ != 0 || local_3c8 != cpp_dec_float_finite)) {
              local_5fc = false;
            }
            _local_628 = _Var9;
            if (((fpclass_type)local_418 == cpp_dec_float_NaN || local_3c8 == cpp_dec_float_NaN) ||
               (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)local_628,
                                    (cpp_dec_float<50U,_int,_void> *)&local_208), 0 < iVar15)) {
              if ((local_488 == cpp_dec_float_NaN) || ((fpclass_type)local_4c8 == cpp_dec_float_NaN)
                 ) {
LAB_002f97b1:
                _local_608 = local_498._0_5_;
                uStack_603 = local_498[1]._1_3_;
                local_618[0] = local_4a8[0];
                local_618[1] = local_4a8[1];
                stack0xfffffffffffff9f0 = auStack_4a0._0_5_;
                uStack_60b = auStack_4a0[1]._1_3_;
                _Stack_620._M_pi = _Stack_4b0._M_pi;
                local_628 = (undefined1  [8])local_4b8;
                _Var9 = _local_628;
                auStack_270[1]._1_3_ = uStack_42b;
                auStack_270._0_5_ = stack0xfffffffffffffbd0;
                local_288 = (element_type *)local_448;
                p_Stack_280 = uStack_440;
                local_278[0] = local_438[0];
                local_278[1] = local_438[1];
                local_268[1]._1_3_ = uStack_423;
                local_268._0_5_ = _local_428;
                local_260 = local_420;
                local_25c = local_41c;
                local_258 = (fpclass_type)local_418;
                iStack_254 = local_418._4_4_;
                local_600 = local_490;
                local_5fc = local_48c;
                local_5f8._4_4_ = iStack_484;
                local_5f8._0_4_ = local_488;
                if ((local_48c == true) &&
                   (local_628._0_4_ = SUB84(local_4b8,0),
                   local_628._0_4_ != 0 || local_488 != cpp_dec_float_finite)) {
                  local_5fc = false;
                }
                _local_628 = _Var9;
                if (((((fpclass_type)local_418 != cpp_dec_float_NaN &&
                       local_488 != cpp_dec_float_NaN) &&
                     (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare((cpp_dec_float<50U,_int,_void> *)local_628,
                                       (cpp_dec_float<50U,_int,_void> *)&local_288), iVar15 < 1)) &&
                    (pSVar24 = (this->
                               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).spxout, pSVar24 != (SPxOut *)0x0)) &&
                   (0 < (int)pSVar24->m_verbosity)) {
                  local_628._0_4_ = pSVar24->m_verbosity;
                  local_50c = 1;
                  (*pSVar24->_vptr_SPxOut[2])(pSVar24,&local_50c);
                  pSVar24 = (this->
                            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).spxout;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (pSVar24->m_streams[pSVar24->m_verbosity],
                             "WMAISM06 Warning! Tiny matrix coefficient ",0x2a);
                  local_2c8 = local_4b8;
                  p_Stack_2c0 = _Stack_4b0._M_pi;
                  local_2b8[0] = local_4a8[0];
                  local_2b8[1] = local_4a8[1];
                  auStack_2b0[0] = auStack_4a0[0];
                  auStack_2b0[1] = auStack_4a0[1];
                  local_2a8[0] = local_498[0];
                  local_2a8[1] = local_498[1];
                  local_2a0 = local_490;
                  local_29c = local_48c;
                  local_298 = local_488;
                  iStack_294 = iStack_484;
                  os = pSVar24->m_streams[pSVar24->m_verbosity];
                  r = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_2c8;
LAB_002f996e:
                  boost::multiprecision::operator<<(os,r);
                  cVar6 = (char)pSVar24->m_streams[pSVar24->m_verbosity];
                  std::ios::widen((char)*(undefined8 *)
                                         (*(long *)pSVar24->m_streams[pSVar24->m_verbosity] + -0x18)
                                  + cVar6);
                  std::ostream::put(cVar6);
                  std::ostream::flush();
                  pSVar24 = (this->
                            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).spxout;
                  (*pSVar24->_vptr_SPxOut[2])(pSVar24,local_628);
                }
              }
              else {
                iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)&local_4b8,
                                    (cpp_dec_float<50U,_int,_void> *)&local_4f8);
                if (iVar15 < 1) {
                  goto LAB_002f97b1;
                }
                pSVar24 = (this->
                          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).spxout;
                if ((pSVar24 != (SPxOut *)0x0) && (0 < (int)pSVar24->m_verbosity)) {
                  local_628._0_4_ = pSVar24->m_verbosity;
                  local_50c = 1;
                  (*pSVar24->_vptr_SPxOut[2])(pSVar24,&local_50c);
                  pSVar24 = (this->
                            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).spxout;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (pSVar24->m_streams[pSVar24->m_verbosity],
                             "WMAISM05 Warning! Big matrix coefficient ",0x29);
                  local_248 = local_4b8;
                  p_Stack_240 = _Stack_4b0._M_pi;
                  local_238[0] = local_4a8[0];
                  local_238[1] = local_4a8[1];
                  auStack_230[0] = auStack_4a0[0];
                  auStack_230[1] = auStack_4a0[1];
                  local_228[0] = local_498[0];
                  local_228[1] = local_498[1];
                  local_220 = local_490;
                  local_21c = local_48c;
                  local_218 = local_488;
                  iStack_214 = iStack_484;
                  os = pSVar24->m_streams[pSVar24->m_verbosity];
                  r = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_248;
                  goto LAB_002f996e;
                }
              }
              uVar27 = uVar27 + 1;
            }
            else {
              pIVar5 = (pSVar28->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.theitem;
              iVar15 = (pSVar28->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thekey
                       [(pIVar3->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .m_elem[(int)uVar27].idx].idx;
              pNVar4 = pIVar5[iVar15].data.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              if (pNVar4 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x0) {
                pIVar5 = pIVar5 + iVar15;
                pcVar20 = (char *)(long)(pIVar5->data).
                                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .memused;
                if (0 < (long)pcVar20) {
                  piVar18 = &pNVar4->idx;
                  __filename = (char *)0x0;
                  do {
                    if (uVar23 == (uint)*piVar18) {
                      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)pIVar5,__filename);
                      break;
                    }
                    __filename = __filename + 1;
                    piVar18 = piVar18 + 0xf;
                  } while (pcVar20 != __filename);
                }
              }
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)pIVar3,(char *)(ulong)uVar27);
              local_478 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                           *)(ulong)((int)local_478 + 1);
            }
          } while ((int)uVar27 <
                   (pIVar3->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused);
        }
      }
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::obj((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_548,pSVar28,(int)uVar23);
      fVar26 = cpp_dec_float_NaN;
      if ((fpclass_type)local_518 == cpp_dec_float_NaN) {
LAB_002f9a5c:
        bVar14 = local_51c;
        uVar27 = local_528[2];
        local_398[0] = local_528[0];
        local_398[1] = local_528[1];
        uStack_3a0 = CONCAT35(uStack_52b,stack0xfffffffffffffad0);
        local_3a8[0] = local_538[0];
        local_3a8[1] = local_538[1];
        local_3b8 = (element_type *)local_548._0_8_;
        _Stack_3b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548._8_8_;
        iVar13 = local_518._4_4_;
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_148,this);
        _local_608 = (undefined5)local_398._0_8_;
        uStack_603 = SUB83(local_398._0_8_,5);
        local_618[0] = local_3a8[0];
        local_618[1] = local_3a8[1];
        stack0xfffffffffffff9f0 = (undefined5)uStack_3a0;
        uStack_60b = (undefined3)((ulong)uStack_3a0 >> 0x28);
        _Stack_620._M_pi = _Stack_3b0._M_pi;
        local_628 = (undefined1  [8])local_3b8;
        _Var9 = _local_628;
        local_600 = uVar27;
        local_5fc = bVar14;
        local_5f8._4_4_ = iVar13;
        local_5f8._0_4_ = fVar26;
        if ((bVar14 == true) &&
           (local_628._0_4_ = SUB84(local_3b8,0),
           local_628._0_4_ != 0 || fVar26 != cpp_dec_float_finite)) {
          local_5fc = false;
        }
        this = local_5d8;
        pSVar28 = local_5f0;
        _local_628 = _Var9;
        if (((fVar26 == cpp_dec_float_NaN) || (local_148.fpclass == cpp_dec_float_NaN)) ||
           (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_628,&local_148),
           this = local_5d8, pSVar28 = local_5f0, 0 < iVar15)) goto LAB_002f9b6f;
        local_628 = (undefined1  [8])0x0;
        _Stack_620._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pAVar29 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                   *)0x0;
LAB_002f9dac:
        local_5fc = false;
        local_600 = 0;
        uStack_603 = 0;
        _local_608 = 0;
        uStack_60b = 0;
        stack0xfffffffffffff9f0 = 0;
        local_618[0] = 0;
        local_618[1] = 0;
        local_5f8._0_4_ = cpp_dec_float_finite;
        local_5f8._4_4_ = 10;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_628,(double)pAVar29);
        (*(pSVar28->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x24])(pSVar28,uVar23 & 0xffffffff,local_628,0);
        local_5cc = local_5cc + 1;
      }
      else {
        local_5f8._0_4_ = cpp_dec_float_finite;
        local_5f8._4_4_ = 10;
        local_628 = (undefined1  [8])0x0;
        _Stack_620._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_618[0] = 0;
        local_618[1] = 0;
        stack0xfffffffffffff9f0 = 0;
        uStack_60b = 0;
        _local_608 = 0;
        uStack_603 = 0;
        local_600 = 0;
        local_5fc = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_628,0.0);
        iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)local_548,
                            (cpp_dec_float<50U,_int,_void> *)local_628);
        if (iVar15 != 0) {
          fVar26 = (fpclass_type)local_518;
          goto LAB_002f9a5c;
        }
LAB_002f9b6f:
        ::soplex::infinity::__tls_init();
        local_5f8._0_4_ = cpp_dec_float_finite;
        local_5f8._4_4_ = 10;
        local_628 = (undefined1  [8])0x0;
        _Stack_620._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_618[0] = 0;
        local_618[1] = 0;
        stack0xfffffffffffff9f0 = 0;
        uStack_60b = 0;
        _local_608 = 0;
        uStack_603 = 0;
        local_600 = 0;
        local_5fc = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_628,(double)local_458);
        if ((((fpclass_type)local_518 != cpp_dec_float_NaN) &&
            ((fpclass_type)local_5f8 != cpp_dec_float_NaN)) &&
           (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_548,
                                (cpp_dec_float<50U,_int,_void> *)local_628), 0 < iVar15)) {
          auStack_4a0[1]._1_3_ = uStack_4db;
          auStack_4a0._0_5_ = stack0xfffffffffffffb20;
          local_4b8 = local_4f8;
          peVar11 = local_4b8;
          _Stack_4b0._M_pi = p_Stack_4f0;
          local_498[1]._1_3_ = uStack_4d3;
          local_498._0_5_ = _local_4d8;
          local_4a8[0] = local_4e8[0];
          local_4a8[1] = local_4e8[1];
          local_490 = local_4d0;
          local_48c = local_4cc;
          local_488 = (fpclass_type)local_4c8;
          iStack_484 = local_4c8._4_4_;
          local_4b8._0_4_ = (uint)local_4f8;
          if ((uint)local_4b8 != 0 || (fpclass_type)local_4c8 != cpp_dec_float_finite) {
            local_48c = (bool)(local_4cc ^ 1);
          }
          local_4b8 = peVar11;
          if ((((fpclass_type)local_4c8 != cpp_dec_float_NaN) &&
              ((fpclass_type)local_518 != cpp_dec_float_NaN)) &&
             (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_548,
                                  (cpp_dec_float<50U,_int,_void> *)&local_4b8), iVar15 < 0)) {
            ::soplex::infinity::__tls_init();
            _local_628 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          )ZEXT816(0);
            pAVar29 = local_458;
            goto LAB_002f9dac;
          }
        }
        ::soplex::infinity::__tls_init();
        local_5f8._0_4_ = cpp_dec_float_finite;
        local_5f8._4_4_ = 10;
        _local_628 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_618[0] = 0;
        local_618[1] = 0;
        stack0xfffffffffffff9f0 = 0;
        uStack_60b = 0;
        _local_608 = 0;
        uStack_603 = 0;
        local_600 = 0;
        local_5fc = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_628,(double)local_508);
        if ((((((fpclass_type)local_518 != cpp_dec_float_NaN) &&
              ((fpclass_type)local_5f8 != cpp_dec_float_NaN)) &&
             (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_548,
                                  (cpp_dec_float<50U,_int,_void> *)local_628), iVar15 < 0)) &&
            (((fpclass_type)local_518 != cpp_dec_float_NaN &&
             ((fpclass_type)local_4c8 != cpp_dec_float_NaN)))) &&
           (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_548,
                                (cpp_dec_float<50U,_int,_void> *)&local_4f8), 0 < iVar15)) {
          ::soplex::infinity::__tls_init();
          local_628 = (undefined1  [8])0x0;
          _Stack_620._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pAVar29 = local_508;
          goto LAB_002f9dac;
        }
      }
      uVar23 = uVar23 + 1;
    } while ((long)uVar23 <
             (long)(pSVar28->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum);
  }
  iVar10 = local_5cc;
  iVar15 = (int)local_5e0;
  iVar16 = (int)local_460;
  iVar21 = (int)local_478;
  if (0 < iVar15 + iVar16 + local_5cc + (int)local_5e8 + iVar21) {
    piVar18 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_remRows;
    *piVar18 = *piVar18 + iVar16;
    piVar18 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_remNzos;
    *piVar18 = *piVar18 + iVar21;
    piVar18 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_chgLRhs;
    *piVar18 = *piVar18 + iVar15;
    piVar18 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_chgBnds;
    *piVar18 = *piVar18 + (int)local_5e8;
    pSVar24 = (this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    if ((pSVar24 != (SPxOut *)0x0) && (3 < (int)pSVar24->m_verbosity)) {
      local_628._0_4_ = pSVar24->m_verbosity;
      local_588 = (element_type *)CONCAT44(local_588._4_4_,4);
      (*pSVar24->_vptr_SPxOut[2])();
      pSVar24 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar24->m_streams[pSVar24->m_verbosity],"Simplifier (extremes) removed ",0x1e);
      std::ostream::operator<<((ostream *)pSVar24->m_streams[pSVar24->m_verbosity],iVar16);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar24->m_streams[pSVar24->m_verbosity]," rows, ",7);
      std::ostream::operator<<((ostream *)pSVar24->m_streams[pSVar24->m_verbosity],iVar21);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar24->m_streams[pSVar24->m_verbosity]," non-zeros, ",0xc);
      std::ostream::operator<<((ostream *)pSVar24->m_streams[pSVar24->m_verbosity],(int)local_5e8);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar24->m_streams[pSVar24->m_verbosity]," col bounds, ",0xd);
      std::ostream::operator<<((ostream *)pSVar24->m_streams[pSVar24->m_verbosity],iVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar24->m_streams[pSVar24->m_verbosity]," row bounds, ",0xd);
      std::ostream::operator<<((ostream *)pSVar24->m_streams[pSVar24->m_verbosity],iVar10);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar24->m_streams[pSVar24->m_verbosity]," objective coefficients",0x17);
      cVar6 = (char)pSVar24->m_streams[pSVar24->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar24->m_streams[pSVar24->m_verbosity] + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      pSVar24 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar24->_vptr_SPxOut[2])(pSVar24,local_628);
    }
  }
  return;
}

Assistant:

void SPxMainSM<R>::handleExtremes(SPxLPBase<R>& lp)
{

   // This method handles extreme value of the given LP by
   //
   // 1. setting numbers of very small absolute values to zero and
   // 2. setting numbers of very large absolute values to R(-infinity) or +R(infinity), respectively.

   R maxVal  = R(infinity) / 5.0;
   R tol = feastol() * 1e-2;
   tol = (tol < this->epsZero()) ? this->epsZero() : tol;
   int  remRows = 0;
   int  remNzos = 0;
   int  chgBnds = 0;
   int  chgLRhs = 0;
   int  objCnt  = 0;

   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      // lhs
      R lhs = lp.lhs(i);

      if(lhs != 0.0 && isZero(lhs, this->epsZero()))
      {
         lp.changeLhs(i, R(0.0));
         ++chgLRhs;
      }
      else if(lhs > R(-infinity) && lhs < -maxVal)
      {
         lp.changeLhs(i, R(-infinity));
         ++chgLRhs;
      }
      else if(lhs <  R(infinity) && lhs >  maxVal)
      {
         lp.changeLhs(i,  R(infinity));
         ++chgLRhs;
      }

      // rhs
      R rhs = lp.rhs(i);

      if(rhs != 0.0 && isZero(rhs, this->epsZero()))
      {
         lp.changeRhs(i, R(0.0));
         ++chgLRhs;
      }
      else if(rhs > R(-infinity) && rhs < -maxVal)
      {
         lp.changeRhs(i, R(-infinity));
         ++chgLRhs;
      }
      else if(rhs <  R(infinity) && rhs >  maxVal)
      {
         lp.changeRhs(i,  R(infinity));
         ++chgLRhs;
      }

      if(lp.lhs(i) <= R(-infinity) && lp.rhs(i) >= R(infinity))
      {
         std::shared_ptr<PostStep> ptr(new FreeConstraintPS(lp, i, this->_tolerances));
         m_hist.append(ptr);

         removeRow(lp, i);
         ++remRows;

         ++m_stat[FREE_ROW];
      }
   }

   for(int j = 0; j < lp.nCols(); ++j)
   {
      // lower bound
      R lo = lp.lower(j);

      if(lo != 0.0 && isZero(lo, this->epsZero()))
      {
         lp.changeLower(j, R(0.0));
         ++chgBnds;
      }
      else if(lo > R(-infinity) && lo < -maxVal)
      {
         lp.changeLower(j, R(-infinity));
         ++chgBnds;
      }
      else if(lo <  R(infinity) && lo >  maxVal)
      {
         lp.changeLower(j,  R(infinity));
         ++chgBnds;
      }

      // upper bound
      R up = lp.upper(j);

      if(up != 0.0 && isZero(up, this->epsZero()))
      {
         lp.changeUpper(j, R(0.0));
         ++chgBnds;
      }
      else if(up > R(-infinity) && up < -maxVal)
      {
         lp.changeUpper(j, R(-infinity));
         ++chgBnds;
      }
      else if(up <  R(infinity) && up >  maxVal)
      {
         lp.changeUpper(j,  R(infinity));
         ++chgBnds;
      }

      // fixed columns will be eliminated later
      if(NE(lo, up, this->tolerances()->epsilon()))
      {
         lo = spxAbs(lo);
         up = spxAbs(up);

         R absBnd = (lo > up) ? lo : up;

         if(absBnd < 1.0)
            absBnd = 1.0;

         // non-zeros
         SVectorBase<R>& col = lp.colVector_w(j);
         int        i = 0;

         while(i < col.size())
         {
            R aij = spxAbs(col.value(i));

            if(isZero(aij * absBnd, tol))
            {
               SVectorBase<R>& row = lp.rowVector_w(col.index(i));
               int row_j = row.pos(j);

               // this changes col.size()
               if(row_j >= 0)
                  row.remove(row_j);

               col.remove(i);

               SPxOut::debug(this, "IMAISM04 aij={}  removed, absBnd={} \n", aij, absBnd);
               ++remNzos;
            }
            else
            {
               if(aij > maxVal)
               {
                  SPX_MSG_WARNING((*this->spxout),
                                  (*this->spxout) << "WMAISM05 Warning! Big matrix coefficient " << aij
                                  << std::endl);
               }
               else if(isZero(aij, tol))
               {
                  SPX_MSG_WARNING((*this->spxout),
                                  (*this->spxout) << "WMAISM06 Warning! Tiny matrix coefficient " << aij
                                  << std::endl);
               }

               ++i;
            }
         }
      }

      // objective
      R obj = lp.obj(j);

      if(obj != 0.0 && isZero(obj, this->epsZero()))
      {
         lp.changeObj(j, R(0.0));
         ++objCnt;
      }
      else if(obj > R(-infinity) && obj < -maxVal)
      {
         lp.changeObj(j, R(-infinity));
         ++objCnt;
      }
      else if(obj <  R(infinity) && obj >  maxVal)
      {
         lp.changeObj(j,  R(infinity));
         ++objCnt;
      }
   }

   if(remRows + remNzos + chgLRhs + chgBnds + objCnt > 0)
   {
      this->m_remRows += remRows;
      this->m_remNzos += remNzos;
      this->m_chgLRhs += chgLRhs;
      this->m_chgBnds += chgBnds;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (extremes) removed "
                    << remRows << " rows, "
                    << remNzos << " non-zeros, "
                    << chgBnds << " col bounds, "
                    << chgLRhs << " row bounds, "
                    << objCnt  << " objective coefficients" << std::endl;)
   }

   assert(lp.isConsistent());
}